

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableSortSpecsSanitize(ImGuiTable *table)

{
  char cVar1;
  ImGuiTableColumn *pIVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  bool bVar12;
  
  iVar7 = table->ColumnsCount;
  if (0 < iVar7) {
    lVar8 = 0x56;
    lVar9 = 0;
    uVar3 = 0;
    uVar6 = 0;
    do {
      pIVar2 = (table->Columns).Data;
      bVar4 = *(byte *)((long)&pIVar2->Flags + lVar8);
      if (bVar4 == 0xff) {
LAB_002371e7:
        bVar4 = 0xff;
      }
      else if (*(char *)((long)&pIVar2->WidthGiven + lVar8) == '\0') {
        *(undefined1 *)((long)&pIVar2->Flags + lVar8) = 0xff;
        iVar7 = table->ColumnsCount;
        goto LAB_002371e7;
      }
      uVar11 = 1L << (bVar4 & 0x3f);
      if (bVar4 == 0xff) {
        uVar11 = 0;
      }
      uVar6 = uVar6 | uVar11;
      uVar3 = uVar3 + (bVar4 != 0xff);
      lVar9 = lVar9 + 1;
      lVar8 = lVar8 + 0x68;
    } while (lVar9 < iVar7);
    if (uVar3 < 2) {
      bVar12 = false;
    }
    else {
      bVar12 = (table->Flags & 0x4000000) == 0;
    }
    if (!(bool)(uVar3 == 0 | (bVar12 ^ 1U) & 1L << ((byte)uVar3 & 0x3f) == uVar6 + 1)) {
      uVar5 = 0;
      uVar6 = 0;
      do {
        uVar10 = 0xffffffff;
        if (0 < (long)table->ColumnsCount) {
          lVar8 = 0x56;
          uVar11 = 0;
          do {
            if ((uVar6 >> (uVar11 & 0x3f) & 1) == 0) {
              pIVar2 = (table->Columns).Data;
              cVar1 = *(char *)((long)&pIVar2->Flags + lVar8);
              if ((cVar1 != -1) &&
                 ((uVar10 == 0xffffffff || (cVar1 < pIVar2[(int)uVar10].SortOrder)))) {
                uVar10 = (uint)uVar11;
              }
            }
            uVar11 = uVar11 + 1;
            lVar8 = lVar8 + 0x68;
          } while ((long)table->ColumnsCount != uVar11);
        }
        (table->Columns).Data[(int)uVar10].SortOrder = (ImGuiTableColumnIdx)uVar5;
        if (bVar12) {
          iVar7 = table->ColumnsCount;
          uVar3 = 1;
          if (0 < iVar7) {
            lVar8 = 0x56;
            uVar6 = 0;
            do {
              if (uVar10 != uVar6) {
                *(undefined1 *)((long)&((table->Columns).Data)->Flags + lVar8) = 0xff;
                iVar7 = table->ColumnsCount;
              }
              uVar6 = uVar6 + 1;
              lVar8 = lVar8 + 0x68;
            } while ((long)uVar6 < (long)iVar7);
          }
          goto LAB_00237353;
        }
        uVar6 = uVar6 | 1L << ((ulong)uVar10 & 0x3f);
        uVar5 = uVar5 + 1;
      } while (uVar5 < uVar3);
    }
    if (uVar3 != 0) goto LAB_00237353;
  }
  uVar3 = 0;
  if (((table->Flags & 0x8000000) == 0) && (uVar3 = 0, 0 < (long)table->ColumnsCount)) {
    pIVar2 = (table->Columns).Data;
    lVar8 = 0;
    do {
      if (((&pIVar2->IsEnabled)[lVar8] == true) &&
         ((*(byte *)((long)&pIVar2->Flags + lVar8 + 1) & 2) == 0)) {
        (&pIVar2->SortOrder)[lVar8] = '\0';
        (&pIVar2->field_0x65)[lVar8] =
             (&pIVar2->field_0x65)[lVar8] & 0xfc | (&pIVar2->SortDirectionsAvailList)[lVar8] & 3;
        uVar3 = 1;
        goto LAB_00237353;
      }
      lVar8 = lVar8 + 0x68;
    } while ((long)table->ColumnsCount * 0x68 - lVar8 != 0);
    uVar3 = 0;
  }
LAB_00237353:
  table->SortSpecsCount = (ImGuiTableColumnIdx)uVar3;
  return;
}

Assistant:

void ImGui::TableSortSpecsSanitize(ImGuiTable* table)
{
    IM_ASSERT(table->Flags & ImGuiTableFlags_Sortable);

    // Clear SortOrder from hidden column and verify that there's no gap or duplicate.
    int sort_order_count = 0;
    ImU64 sort_order_mask = 0x00;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (column->SortOrder != -1 && !column->IsEnabled)
            column->SortOrder = -1;
        if (column->SortOrder == -1)
            continue;
        sort_order_count++;
        sort_order_mask |= ((ImU64)1 << column->SortOrder);
        IM_ASSERT(sort_order_count < (int)sizeof(sort_order_mask) * 8);
    }

    const bool need_fix_linearize = ((ImU64)1 << sort_order_count) != (sort_order_mask + 1);
    const bool need_fix_single_sort_order = (sort_order_count > 1) && !(table->Flags & ImGuiTableFlags_SortMulti);
    if (need_fix_linearize || need_fix_single_sort_order)
    {
        ImU64 fixed_mask = 0x00;
        for (int sort_n = 0; sort_n < sort_order_count; sort_n++)
        {
            // Fix: Rewrite sort order fields if needed so they have no gap or duplicate.
            // (e.g. SortOrder 0 disappeared, SortOrder 1..2 exists --> rewrite then as SortOrder 0..1)
            int column_with_smallest_sort_order = -1;
            for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                if ((fixed_mask & ((ImU64)1 << (ImU64)column_n)) == 0 && table->Columns[column_n].SortOrder != -1)
                    if (column_with_smallest_sort_order == -1 || table->Columns[column_n].SortOrder < table->Columns[column_with_smallest_sort_order].SortOrder)
                        column_with_smallest_sort_order = column_n;
            IM_ASSERT(column_with_smallest_sort_order != -1);
            fixed_mask |= ((ImU64)1 << column_with_smallest_sort_order);
            table->Columns[column_with_smallest_sort_order].SortOrder = (ImGuiTableColumnIdx)sort_n;

            // Fix: Make sure only one column has a SortOrder if ImGuiTableFlags_MultiSortable is not set.
            if (need_fix_single_sort_order)
            {
                sort_order_count = 1;
                for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                    if (column_n != column_with_smallest_sort_order)
                        table->Columns[column_n].SortOrder = -1;
                break;
            }
        }
    }

    // Fallback default sort order (if no column had the ImGuiTableColumnFlags_DefaultSort flag)
    if (sort_order_count == 0 && !(table->Flags & ImGuiTableFlags_SortTristate))
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            if (column->IsEnabled && !(column->Flags & ImGuiTableColumnFlags_NoSort))
            {
                sort_order_count = 1;
                column->SortOrder = 0;
                column->SortDirection = (ImU8)TableGetColumnAvailSortDirection(column, 0);
                break;
            }
        }

    table->SortSpecsCount = (ImGuiTableColumnIdx)sort_order_count;
}